

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall booster::bad_callback_call::bad_callback_call(bad_callback_call *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"bad_callback_call",&local_31);
  runtime_error::runtime_error(&this->super_runtime_error,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_0010cae8;
  (this->super_runtime_error).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__bad_callback_call_0010cb10;
  return;
}

Assistant:

bad_callback_call() : 
			booster::runtime_error("bad_callback_call")
		{
		}